

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O0

void cf2_hintmap_insertHint(CF2_HintMap hintmap,CF2_Hint bottomHintEdge,CF2_Hint topHintEdge)

{
  undefined4 uVar1;
  FT_Bool FVar2;
  CF2_F16Dot16 CVar3;
  FT_Int32 FVar4;
  CF2_HintRec *pCVar5;
  CF2_HintRec *pCVar6;
  bool bVar7;
  uint local_50;
  int local_4c;
  uint local_48;
  FT_UFast count;
  FT_UFast iDst;
  FT_UFast iSrc;
  CF2_F16Dot16 halfWidth;
  CF2_F16Dot16 midpoint;
  CF2_Hint secondHintEdge;
  CF2_Hint firstHintEdge;
  FT_Bool isPair;
  FT_UFast indexInsert;
  CF2_Hint topHintEdge_local;
  CF2_Hint bottomHintEdge_local;
  CF2_HintMap hintmap_local;
  
  FVar2 = cf2_hint_isValid(bottomHintEdge);
  if (FVar2 == '\0') {
    bVar7 = false;
    secondHintEdge = topHintEdge;
  }
  else {
    FVar2 = cf2_hint_isValid(topHintEdge);
    bVar7 = FVar2 != '\0';
    secondHintEdge = bottomHintEdge;
  }
  if ((!bVar7) || (bottomHintEdge->csCoord <= topHintEdge->csCoord)) {
    firstHintEdge._4_4_ = 0;
    while ((firstHintEdge._4_4_ < hintmap->count &&
           (hintmap->edge[firstHintEdge._4_4_].csCoord < secondHintEdge->csCoord))) {
      firstHintEdge._4_4_ = firstHintEdge._4_4_ + 1;
    }
    if ((hintmap->count <= firstHintEdge._4_4_) ||
       ((hintmap->edge[firstHintEdge._4_4_].csCoord != secondHintEdge->csCoord &&
        (((!bVar7 || (topHintEdge->csCoord < hintmap->edge[firstHintEdge._4_4_].csCoord)) &&
         (FVar2 = cf2_hint_isPairTop(hintmap->edge + firstHintEdge._4_4_), FVar2 == '\0')))))) {
      FVar2 = cf2_hintmap_isValid(hintmap->initialHintMap);
      if ((FVar2 != '\0') && (FVar2 = cf2_hint_isLocked(secondHintEdge), FVar2 == '\0')) {
        if (bVar7) {
          CVar3 = cf2_hintmap_map(hintmap->initialHintMap,
                                  (topHintEdge->csCoord + secondHintEdge->csCoord) / 2);
          FVar4 = FT_MulFix_x86_64((topHintEdge->csCoord - secondHintEdge->csCoord) / 2,
                                   hintmap->scale);
          secondHintEdge->dsCoord = CVar3 - FVar4;
          topHintEdge->dsCoord = CVar3 + FVar4;
        }
        else {
          CVar3 = cf2_hintmap_map(hintmap->initialHintMap,secondHintEdge->csCoord);
          secondHintEdge->dsCoord = CVar3;
        }
      }
      if ((firstHintEdge._4_4_ == 0) ||
         (hintmap->edge[firstHintEdge._4_4_ - 1].dsCoord <= secondHintEdge->dsCoord)) {
        if (firstHintEdge._4_4_ < hintmap->count) {
          if (bVar7) {
            if (hintmap->edge[firstHintEdge._4_4_].dsCoord < topHintEdge->dsCoord) {
              return;
            }
          }
          else if (hintmap->edge[firstHintEdge._4_4_].dsCoord < secondHintEdge->dsCoord) {
            return;
          }
        }
        count = hintmap->count;
        if (bVar7) {
          local_50 = hintmap->count + 1;
        }
        else {
          local_50 = hintmap->count;
        }
        local_48 = local_50;
        local_4c = hintmap->count - firstHintEdge._4_4_;
        if (local_50 < 0xc0) {
          while( true ) {
            count = count - 1;
            if (local_4c == 0) break;
            pCVar5 = hintmap->edge + local_48;
            pCVar6 = hintmap->edge + count;
            uVar1 = *(undefined4 *)&pCVar6->field_0x4;
            pCVar5->flags = pCVar6->flags;
            *(undefined4 *)&pCVar5->field_0x4 = uVar1;
            pCVar5->index = pCVar6->index;
            CVar3 = pCVar6->dsCoord;
            pCVar5->csCoord = pCVar6->csCoord;
            pCVar5->dsCoord = CVar3;
            uVar1 = *(undefined4 *)&pCVar6->field_0x1c;
            pCVar5->scale = pCVar6->scale;
            *(undefined4 *)&pCVar5->field_0x1c = uVar1;
            local_4c = local_4c + -1;
            local_48 = local_48 - 1;
          }
          pCVar5 = hintmap->edge + firstHintEdge._4_4_;
          uVar1 = *(undefined4 *)&secondHintEdge->field_0x4;
          pCVar5->flags = secondHintEdge->flags;
          *(undefined4 *)&pCVar5->field_0x4 = uVar1;
          pCVar5->index = secondHintEdge->index;
          CVar3 = secondHintEdge->dsCoord;
          pCVar5->csCoord = secondHintEdge->csCoord;
          pCVar5->dsCoord = CVar3;
          uVar1 = *(undefined4 *)&secondHintEdge->field_0x1c;
          pCVar5->scale = secondHintEdge->scale;
          *(undefined4 *)&pCVar5->field_0x1c = uVar1;
          hintmap->count = hintmap->count + 1;
          if (bVar7) {
            pCVar5 = hintmap->edge + (firstHintEdge._4_4_ + 1);
            uVar1 = *(undefined4 *)&topHintEdge->field_0x4;
            pCVar5->flags = topHintEdge->flags;
            *(undefined4 *)&pCVar5->field_0x4 = uVar1;
            pCVar5->index = topHintEdge->index;
            CVar3 = topHintEdge->dsCoord;
            pCVar5->csCoord = topHintEdge->csCoord;
            pCVar5->dsCoord = CVar3;
            uVar1 = *(undefined4 *)&topHintEdge->field_0x1c;
            pCVar5->scale = topHintEdge->scale;
            *(undefined4 *)&pCVar5->field_0x1c = uVar1;
            hintmap->count = hintmap->count + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
  cf2_hintmap_insertHint( CF2_HintMap  hintmap,
                          CF2_Hint     bottomHintEdge,
                          CF2_Hint     topHintEdge )
  {
    CF2_UInt  indexInsert;

    /* set default values, then check for edge hints */
    FT_Bool   isPair         = TRUE;
    CF2_Hint  firstHintEdge  = bottomHintEdge;
    CF2_Hint  secondHintEdge = topHintEdge;


    /* one or none of the input params may be invalid when dealing with */
    /* edge hints; at least one edge must be valid                      */
    FT_ASSERT( cf2_hint_isValid( bottomHintEdge ) ||
               cf2_hint_isValid( topHintEdge )    );

    /* determine how many and which edges to insert */
    if ( !cf2_hint_isValid( bottomHintEdge ) )
    {
      /* insert only the top edge */
      firstHintEdge = topHintEdge;
      isPair        = FALSE;
    }
    else if ( !cf2_hint_isValid( topHintEdge ) )
    {
      /* insert only the bottom edge */
      isPair = FALSE;
    }

    /* paired edges must be in proper order */
    if ( isPair                                         &&
         topHintEdge->csCoord < bottomHintEdge->csCoord )
      return;

    /* linear search to find index value of insertion point */
    indexInsert = 0;
    for ( ; indexInsert < hintmap->count; indexInsert++ )
    {
      if ( hintmap->edge[indexInsert].csCoord >= firstHintEdge->csCoord )
        break;
    }

    FT_TRACE7(( "  Got hint at %.2f (%.2f)\n",
                firstHintEdge->csCoord / 65536.0,
                firstHintEdge->dsCoord / 65536.0 ));
    if ( isPair )
      FT_TRACE7(( "  Got hint at %.2f (%.2f)\n",
                  secondHintEdge->csCoord / 65536.0,
                  secondHintEdge->dsCoord / 65536.0 ));

    /*
     * Discard any hints that overlap in character space.  Most often, this
     * is while building the initial map, where captured hints from all
     * zones are combined.  Define overlap to include hints that `touch'
     * (overlap zero).  Hiragino Sans/Gothic fonts have numerous hints that
     * touch.  Some fonts have non-ideographic glyphs that overlap our
     * synthetic hints.
     *
     * Overlap also occurs when darkening stem hints that are close.
     *
     */
    if ( indexInsert < hintmap->count )
    {
      /* we are inserting before an existing edge:    */
      /* verify that an existing edge is not the same */
      if ( hintmap->edge[indexInsert].csCoord == firstHintEdge->csCoord )
        return; /* ignore overlapping stem hint */

      /* verify that a new pair does not straddle the next edge */
      if ( isPair                                                        &&
           hintmap->edge[indexInsert].csCoord <= secondHintEdge->csCoord )
        return; /* ignore overlapping stem hint */

      /* verify that we are not inserting between paired edges */
      if ( cf2_hint_isPairTop( &hintmap->edge[indexInsert] ) )
        return; /* ignore overlapping stem hint */
    }

    /* recompute device space locations using initial hint map */
    if ( cf2_hintmap_isValid( hintmap->initialHintMap ) &&
         !cf2_hint_isLocked( firstHintEdge )            )
    {
      if ( isPair )
      {
        /* Use hint map to position the center of stem, and nominal scale */
        /* to position the two edges.  This preserves the stem width.     */
        CF2_Fixed  midpoint =
                     cf2_hintmap_map(
                       hintmap->initialHintMap,
                       ADD_INT32( secondHintEdge->csCoord,
                                  firstHintEdge->csCoord ) / 2 );
        CF2_Fixed  halfWidth =
                     FT_MulFix( SUB_INT32( secondHintEdge->csCoord,
                                           firstHintEdge->csCoord ) / 2,
                                hintmap->scale );


        firstHintEdge->dsCoord  = SUB_INT32( midpoint, halfWidth );
        secondHintEdge->dsCoord = ADD_INT32( midpoint, halfWidth );
      }
      else
        firstHintEdge->dsCoord = cf2_hintmap_map( hintmap->initialHintMap,
                                                  firstHintEdge->csCoord );
    }

    /*
     * Discard any hints that overlap in device space; this can occur
     * because locked hints have been moved to align with blue zones.
     *
     * TODO: Although we might correct this later during adjustment, we
     * don't currently have a way to delete a conflicting hint once it has
     * been inserted.  See v2.030 MinionPro-Regular, 12 ppem darkened,
     * initial hint map for second path, glyph 945 (the perispomeni (tilde)
     * in U+1F6E, Greek omega with psili and perispomeni).  Darkening is
     * 25.  Pair 667,747 initially conflicts in design space with top edge
     * 660.  This is because 667 maps to 7.87, and the top edge was
     * captured by a zone at 8.0.  The pair is later successfully inserted
     * in a zone without the top edge.  In this zone it is adjusted to 8.0,
     * and no longer conflicts with the top edge in design space.  This
     * means it can be included in yet a later zone which does have the top
     * edge hint.  This produces a small mismatch between the first and
     * last points of this path, even though the hint masks are the same.
     * The density map difference is tiny (1/256).
     *
     */

    if ( indexInsert > 0 )
    {
      /* we are inserting after an existing edge */
      if ( firstHintEdge->dsCoord < hintmap->edge[indexInsert - 1].dsCoord )
        return;
    }

    if ( indexInsert < hintmap->count )
    {
      /* we are inserting before an existing edge */
      if ( isPair )
      {
        if ( secondHintEdge->dsCoord > hintmap->edge[indexInsert].dsCoord )
          return;
      }
      else
      {
        if ( firstHintEdge->dsCoord > hintmap->edge[indexInsert].dsCoord )
          return;
      }
    }

    /* make room to insert */
    {
      CF2_UInt  iSrc = hintmap->count - 1;
      CF2_UInt  iDst = isPair ? hintmap->count + 1 : hintmap->count;

      CF2_UInt  count = hintmap->count - indexInsert;


      if ( iDst >= CF2_MAX_HINT_EDGES )
      {
        FT_TRACE4(( "cf2_hintmap_insertHint: too many hintmaps\n" ));
        return;
      }

      while ( count-- )
        hintmap->edge[iDst--] = hintmap->edge[iSrc--];

      /* insert first edge */
      hintmap->edge[indexInsert] = *firstHintEdge;         /* copy struct */
      hintmap->count            += 1;

      FT_TRACE7(( "  Inserting hint %.2f (%.2f)\n",
                  firstHintEdge->csCoord / 65536.0,
                  firstHintEdge->dsCoord / 65536.0 ));

      if ( isPair )
      {
        /* insert second edge */
        hintmap->edge[indexInsert + 1] = *secondHintEdge;  /* copy struct */
        hintmap->count                += 1;

        FT_TRACE7(( "  Inserting hint %.2f (%.2f)\n",
                    secondHintEdge->csCoord / 65536.0,
                    secondHintEdge->dsCoord / 65536.0 ));

      }
    }

    return;
  }